

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectProgramStageiv
          (FunctionalTest3_4 *this,GLuint program_id)

{
  bool bVar1;
  bool bVar2;
  GLuint i;
  long lVar3;
  inspectionDetails details [5];
  GLenum local_58 [12];
  
  local_58[0] = 0x8de6;
  local_58[1] = this->m_n_active_subroutine_uniforms;
  local_58[2] = 0x8e47;
  local_58[3] = this->m_n_active_subroutine_uniform_locations;
  local_58[4] = 0x8de5;
  local_58[5] = this->m_n_active_subroutines;
  local_58[6] = 0x8e49;
  local_58[7] = this->m_n_active_subroutine_uniform_name_length + 1;
  local_58[8] = 0x8e48;
  local_58[9] = this->m_n_active_subroutine_name_length + 1;
  bVar2 = true;
  lVar3 = 0;
  do {
    bVar1 = checkProgramStageiv(this,program_id,local_58[lVar3 * 2],local_58[lVar3 * 2 + 1]);
    if (!bVar1) {
      bVar2 = false;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return bVar2;
}

Assistant:

bool FunctionalTest3_4::inspectProgramStageiv(glw::GLuint program_id) const
{
	bool result = true;

	const inspectionDetails details[] = {
		{ GL_ACTIVE_SUBROUTINE_UNIFORMS, m_n_active_subroutine_uniforms },
		{ GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS, m_n_active_subroutine_uniform_locations },
		{ GL_ACTIVE_SUBROUTINES, m_n_active_subroutines },
		{ GL_ACTIVE_SUBROUTINE_UNIFORM_MAX_LENGTH, m_n_active_subroutine_uniform_name_length + 1 },
		{ GL_ACTIVE_SUBROUTINE_MAX_LENGTH, m_n_active_subroutine_name_length + 1 }
	};
	const GLuint n_details = sizeof(details) / sizeof(details[0]);

	for (GLuint i = 0; i < n_details; ++i)
	{
		if (false == checkProgramStageiv(program_id, details[i].pname, details[i].expected_value))
		{
			result = false;
		}
	}

	return result;
}